

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void UTF_fgets_test2(char *fname)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  char buf [128];
  undefined8 uStack_b0;
  char local_a8;
  undefined7 uStack_a7;
  ushort local_a0;
  
  uStack_b0 = 0x103586;
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    UTF_test(0x7f,false);
    return;
  }
  uStack_b0 = 0x10359d;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x103762;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_001035a5;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      local_a0 = local_a0 & 0xff;
      sVar5 = 9;
LAB_001039d1:
      if (sVar5 - sVar3 != 0) {
        uStack_b0 = 0x1039e6;
        iVar1 = fseek(__stream,sVar5 - sVar3,1);
        if (iVar1 != 0) goto LAB_001035a5;
      }
    }
    else {
      if (sVar5 != sVar3) goto LAB_001039d1;
      (&local_a8)[sVar3] = '\0';
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_001035a5:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x1035ba;
  UTF_test(0x83,pcVar2 == &local_a8);
  uStack_b0 = 0x1035e4;
  UTF_test(0x84,local_a0 == 0x38 && CONCAT71(uStack_a7,local_a8) == 0x3736353433323130);
  uStack_b0 = 0x1035ec;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x1037b0;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_001035f4;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      local_a0 = local_a0 & 0xff;
      sVar5 = 9;
LAB_00103a2c:
      if (sVar5 - sVar3 != 0) {
        uStack_b0 = 0x103a41;
        iVar1 = fseek(__stream,sVar5 - sVar3,1);
        if (iVar1 != 0) goto LAB_001035f4;
      }
    }
    else {
      if (sVar5 != sVar3) goto LAB_00103a2c;
      (&local_a8)[sVar3] = '\0';
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_001035f4:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x103609;
  UTF_test(0x85,pcVar2 == &local_a8);
  uStack_b0 = 0x103633;
  UTF_test(0x86,local_a0 == 0x37 && CONCAT71(uStack_a7,local_a8) == 0x3635343332313039);
  uStack_b0 = 0x10363b;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x1037fe;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_00103643;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      local_a0 = local_a0 & 0xff;
      sVar5 = 9;
LAB_00103a87:
      if (sVar5 - sVar3 != 0) {
        uStack_b0 = 0x103a9c;
        iVar1 = fseek(__stream,sVar5 - sVar3,1);
        if (iVar1 != 0) goto LAB_00103643;
      }
    }
    else {
      if (sVar5 != sVar3) goto LAB_00103a87;
      (&local_a8)[sVar3] = '\0';
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_00103643:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x103658;
  UTF_test(0x87,pcVar2 == &local_a8);
  uStack_b0 = 0x103682;
  UTF_test(0x88,local_a0 == 0x36 && CONCAT71(uStack_a7,local_a8) == 0x3534333231303938);
  uStack_b0 = 0x10368a;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x10384c;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_00103692;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      local_a0 = local_a0 & 0xff;
      sVar5 = 9;
LAB_00103ae2:
      if (sVar5 - sVar3 != 0) {
        uStack_b0 = 0x103af7;
        iVar1 = fseek(__stream,sVar5 - sVar3,1);
        if (iVar1 != 0) goto LAB_00103692;
      }
    }
    else {
      if (sVar5 != sVar3) goto LAB_00103ae2;
      (&local_a8)[sVar3] = '\0';
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_00103692:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x1036a7;
  UTF_test(0x89,pcVar2 == &local_a8);
  uStack_b0 = 0x1036cd;
  UTF_test(0x8a,(char)local_a0 == '\0' && CONCAT71(uStack_a7,local_a8) == 0x3433323130393837);
  uStack_b0 = 0x1036d5;
  iVar1 = feof(__stream);
  bVar7 = true;
  if (iVar1 != 0) goto LAB_0010397e;
  sVar4 = 1;
  uStack_b0 = 0x1036fb;
  sVar3 = fread(&local_a8,1,10,__stream);
  if (sVar3 == 0) goto LAB_0010397e;
  do {
    if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
      if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
        if (sVar4 == 10) {
          sVar4 = sVar4 - 1;
        }
        (&local_a8)[sVar4] = '\0';
        sVar5 = sVar4;
      }
      else {
        *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
        sVar5 = sVar4;
      }
      break;
    }
    bVar6 = sVar4 != sVar3;
    sVar5 = sVar3;
    sVar4 = sVar4 + 1;
  } while (bVar6);
  if (sVar5 == 10) {
    local_a0 = local_a0 & 0xff;
    sVar5 = 9;
LAB_0010395d:
    if (sVar5 - sVar3 != 0) {
      uStack_b0 = 0x103972;
      iVar1 = fseek(__stream,sVar5 - sVar3,1);
      if (iVar1 != 0) goto LAB_0010397e;
    }
  }
  else {
    if (sVar5 != sVar3) goto LAB_0010395d;
    (&local_a8)[sVar3] = '\0';
  }
  bVar7 = local_a8 == '\0';
LAB_0010397e:
  uStack_b0 = 0x10398c;
  UTF_test(0x8b,bVar7);
  uStack_b0 = 0x103994;
  fclose(__stream);
  return;
}

Assistant:

void UTF_fgets_test2(const char *fname)
{
    FILE *fp;
    char buf[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "012345678") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "901234567") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "890123456") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "78901234") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == NULL);

    fclose(fp);
}